

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O0

ostream * cpp_bindgen::_impl::write_fortran_binding<void(bindgen_fortran_array_descriptor*)>
                    (ostream *strm,char *c_name,char *fortran_name)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  anon_class_8_1_8991b55a_for_m_fun local_250;
  fortran_param_type_from_c_f local_242;
  allocator<char> local_241;
  string local_240;
  string local_220;
  string local_200;
  anon_class_8_1_448b3c02_for_m_fun local_1e0;
  ignore_type_f local_1d5 [13];
  string local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream tmp_strm;
  ostream local_198 [376];
  char *local_20;
  char *fortran_name_local;
  char *c_name_local;
  ostream *strm_local;
  
  local_20 = fortran_name;
  fortran_name_local = c_name;
  c_name_local = (char *)strm;
  std::__cxx11::stringstream::stringstream(local_1a8);
  fortran_return_type<void,_0>();
  poVar3 = std::operator<<(local_198,local_1c8);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,local_20);
  std::operator<<(poVar3,"(");
  std::__cxx11::string::~string(local_1c8);
  local_1e0.tmp_strm = (stringstream *)local_1a8;
  for_each_param<void(bindgen_fortran_array_descriptor*),cpp_bindgen::_impl::ignore_type_f,cpp_bindgen::_impl::write_fortran_binding<void(bindgen_fortran_array_descriptor*)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_1_,std::tuple<bindgen_fortran_array_descriptor*>>
            (local_1d5,&local_1e0);
  std::operator<<(local_198,")");
  iVar2 = strcmp(fortran_name_local,local_20);
  if (iVar2 == 0) {
    std::operator<<(local_198," bind(c)");
  }
  else {
    poVar3 = std::operator<<(local_198," bind(c, name=\"");
    poVar3 = std::operator<<(poVar3,fortran_name_local);
    std::operator<<(poVar3,"\")");
  }
  pcVar1 = c_name_local;
  std::__cxx11::stringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"    ",&local_241);
  wrap_line(&local_200,&local_220,&local_240);
  std::operator<<((ostream *)pcVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_220);
  std::operator<<((ostream *)c_name_local,"      use iso_c_binding\n");
  std::operator<<((ostream *)c_name_local,"      use bindgen_array_descriptor\n");
  local_250.strm = (ostream *)c_name_local;
  for_each_param<void(bindgen_fortran_array_descriptor*),cpp_bindgen::_impl::fortran_param_type_from_c_f,cpp_bindgen::_impl::write_fortran_binding<void(bindgen_fortran_array_descriptor*)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_2_,std::tuple<bindgen_fortran_array_descriptor*>>
            (&local_242,&local_250);
  poVar3 = std::operator<<((ostream *)c_name_local,"    end ");
  fortran_function_specifier<void,_0>();
  std::operator+(&local_270,&local_290,"\n");
  poVar3 = std::operator<<(poVar3,(string *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return poVar3;
}

Assistant:

std::ostream &write_fortran_binding(std::ostream &strm, char const *c_name, char const *fortran_name) {
            std::stringstream tmp_strm;
            tmp_strm << fortran_return_type<typename function_traits::result_type<CSignature>::type>() << " "
                     << fortran_name << "(";
            for_each_param<CSignature>(ignore_type_f{}, [&](const std::string &, int i) {
                if (i)
                    tmp_strm << ", ";
                tmp_strm << "arg" << i;
            });
            tmp_strm << ")";
            if (strcmp(c_name, fortran_name) == 0)
                tmp_strm << " bind(c)";
            else
                tmp_strm << " bind(c, name=\"" << c_name << "\")";
            strm << wrap_line(tmp_strm.str(), "    ");
            strm << "      use iso_c_binding\n";
            if (has_array_descriptor<CSignature>::value)
                strm << "      use bindgen_array_descriptor\n";
            for_each_param<CSignature>(fortran_param_type_from_c_f{},
                [&](const std::string &type_name, int i) { strm << "      " << type_name << " :: arg" << i << "\n"; });
            return strm << "    end "
                        << fortran_function_specifier<typename function_traits::result_type<CSignature>::type>() + "\n";
        }